

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O3

void __thiscall MemoryManager::~MemoryManager(MemoryManager *this)

{
  void *pvVar1;
  long lVar2;
  uint8_t **(*__range1) [1024];
  long lVar3;
  uint16_t j;
  long lVar4;
  
  lVar3 = 0;
  do {
    if (*(long *)((long)this->memory + lVar3) != 0) {
      lVar4 = 0;
      do {
        lVar2 = *(long *)((long)this->memory + lVar3);
        pvVar1 = *(void **)(lVar2 + lVar4 * 8);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
          lVar2 = *(long *)((long)this->memory + lVar3);
        }
        *(undefined8 *)(lVar2 + lVar4 * 8) = 0;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x400);
      pvVar1 = *(void **)((long)this->memory + lVar3);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      *(undefined8 *)((long)this->memory + lVar3) = 0;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x2000);
  return;
}

Assistant:

MemoryManager::~MemoryManager(){
    for(auto & i : this->memory){
        if(i){
            for(uint16_t j = 0; j < 1024; j++){
                if(i[j])
                    delete[] i[j];
                i[j] = nullptr;
            }
            delete[] i;
            i = nullptr;
        }
    }
}